

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.c
# Opt level: O2

void write_fifo(gba_apu_t *apu,int channel,uint32_t value,uint32_t mask)

{
  int iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  
  if (apu->enable_audio == true) {
    if (1 < channel) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/audio/audio.c",
              0x55);
      fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m","tried to fill FIFO >1");
      exit(1);
    }
    uVar2 = apu->fifo[channel].write_index;
    if ((int)uVar2 - (int)apu->fifo[channel].read_index < 0x1d) {
      for (iVar1 = 0; iVar1 != 0x20; iVar1 = iVar1 + 8) {
        uVar3 = uVar2;
        if ((char)(mask >> ((byte)iVar1 & 0x1f)) == -1) {
          uVar3 = uVar2 + 1;
          apu->fifo[channel].write_index = uVar3;
          apu->fifo[channel].buf[(uint)uVar2 & 0x1f] = (uint8_t)(value >> ((byte)iVar1 & 0x1f));
        }
        uVar2 = uVar3;
      }
    }
  }
  return;
}

Assistant:

void write_fifo(gba_apu_t* apu, int channel, word value, word mask) {
#ifdef ENABLE_AUDIO
    if (!apu->enable_audio) {
        return;
    }
    unimplemented(channel > 1, "tried to fill FIFO >1")
    int size = apu->fifo[channel].write_index - apu->fifo[channel].read_index;
    if (size <= 28) {
        for (int b = 0; b < 4; b++) {
            byte sample = (value >> (b * 8)) & 0xFF;
            byte bmask = (mask >> (b * 8)) & 0xFF;
            if (bmask == 0xFF) {
                apu->fifo[channel].buf[(apu->fifo[channel].write_index++) % SOUND_FIFO_SIZE] = sample;
            }
        }
    }
#endif
}